

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint needle;
  uint needle_00;
  size_t sVar2;
  size_t n;
  long lVar3;
  timeval tv;
  int arr [200];
  
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  srand((uint)tv.tv_sec);
  for (lVar3 = 0; lVar3 != 200; lVar3 = lVar3 + 1) {
    iVar1 = rand();
    arr[lVar3] = iVar1 % 0x15;
  }
  needle = minimum(arr,200);
  needle_00 = maximum(arr,200);
  sVar2 = n_occurences(arr,200,needle);
  printf("The minimum is %d and it occurs %zu times.\n",(ulong)needle,sVar2);
  sVar2 = n_occurences(arr,200,needle_00);
  printf("The maximum is %d and it occurs %zu times.\n",(ulong)needle_00,sVar2);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, NULL);

  int arr[ARR_LEN];
  srand((unsigned int)tv.tv_sec);
  for (size_t n = 0; n < ARR_LEN; n++) {
    arr[n] = rand() % 21;
  }

  int min = minimum(arr, ARR_LEN);
  int max = maximum(arr, ARR_LEN);
  printf("The minimum is %d and it occurs %zu times.\n", min, n_occurences(arr, ARR_LEN, min));
  printf("The maximum is %d and it occurs %zu times.\n", max, n_occurences(arr, ARR_LEN, max));

  return 0;
}